

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,IStream *is,int numThreads)

{
  Data **ppDVar1;
  int iVar2;
  Data *pDVar3;
  InputStreamMutex *pIVar4;
  undefined4 extraout_var;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_0036b890;
  pDVar3 = (Data *)operator_new(0x180);
  Data::Data(pDVar3,numThreads);
  ppDVar1 = &this->_data;
  this->_data = pDVar3;
  pDVar3->_deleteStream = false;
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,is,&pDVar3->version);
  pDVar3 = *ppDVar1;
  if ((pDVar3->version & 0x1000) == 0) {
    pIVar4 = (InputStreamMutex *)operator_new(0x38);
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar4->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
    pIVar4->currentPosition = 0;
    pDVar3->_streamData = pIVar4;
    pIVar4->is = is;
    Header::readFrom(&pDVar3->header,is,&pDVar3->version);
    initialize(this);
    pDVar3 = *ppDVar1;
    TileOffsets::readFrom
              (&pDVar3->tileOffsets,pDVar3->_streamData->is,&pDVar3->fileIsComplete,false,false);
    iVar2 = (*(*ppDVar1)->_streamData->is->_vptr_IStream[2])();
    pDVar3 = *ppDVar1;
    pDVar3->memoryMapped = SUB41(iVar2,0);
    iVar2 = (*pDVar3->_streamData->is->_vptr_IStream[5])();
    (*ppDVar1)->_streamData->currentPosition = CONCAT44(extraout_var,iVar2);
  }
  else {
    compatibilityInitialize(this,is);
  }
  return;
}

Assistant:

TiledInputFile::TiledInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int numThreads):
    _data (new Data (numThreads))
{
    _data->_deleteStream=false;
    //
    // This constructor is called when a user
    // explicitly wants to read a tiled file.
    //

    bool streamDataCreated = false;

    try
    {
        try
        {
            readMagicNumberAndVersionField(is, _data->version);

            //
            // Backward compatibility to read multpart file.
            //
            if (isMultiPart(_data->version))
            {
                compatibilityInitialize(is);
                return;
            }

            streamDataCreated = true;
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = &is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            initialize();
            // file is guaranteed to be single part, regular image
            _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,false);
            _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
            _data->_streamData->currentPosition = _data->_streamData->is->tellg();
        }
        catch (IEX_NAMESPACE::BaseExc &e)
        {
            REPLACE_EXC (e, "Cannot open image file "
                    "\"" << is.fileName() << "\". " << e.what());
            throw;
        }
    }
    catch (...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if( _data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        if (streamDataCreated) delete _data->_streamData;
	delete _data;
        throw;
    }
}